

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O1

HighsDebugStatus debugBasisRightSize(HighsOptions *options,HighsLp *lp,HighsBasis *basis)

{
  bool bVar1;
  HighsDebugStatus HVar2;
  
  if (0 < (options->super_HighsOptionsStruct).highs_debug_level) {
    bVar1 = isBasisRightSize(lp,basis);
    HVar2 = kOk;
    if (!bVar1) {
      highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,
                   "HiGHS basis size error\n");
      HVar2 = kLogicalError;
    }
    return HVar2;
  }
  return kNotChecked;
}

Assistant:

HighsDebugStatus debugBasisRightSize(const HighsOptions& options,
                                     const HighsLp& lp,
                                     const HighsBasis& basis) {
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  bool right_size = isBasisRightSize(lp, basis);
  if (!right_size) {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "HiGHS basis size error\n");
    assert(right_size);
    return_status = HighsDebugStatus::kLogicalError;
  }
  return return_status;
}